

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O0

void __thiscall
QCache<QtFontFallbacksCacheKey,_QList<QString>_>::trim
          (QCache<QtFontFallbacksCacheKey,_QList<QString>_> *this,qsizetype m)

{
  bool bVar1;
  long in_RSI;
  QCache<QtFontFallbacksCacheKey,_QList<QString>_> *in_RDI;
  Node *n;
  
  while( true ) {
    bVar1 = false;
    if ((QCache<QtFontFallbacksCacheKey,_QList<QString>_> *)(in_RDI->chain).prev != in_RDI) {
      bVar1 = in_RSI < in_RDI->total;
    }
    if (!bVar1) break;
    unlink(in_RDI,(char *)(in_RDI->chain).prev);
  }
  return;
}

Assistant:

void trim(qsizetype m) noexcept(std::is_nothrow_destructible_v<Node>)
    {
        while (chain.prev != &chain && total > m) {
            Node *n = static_cast<Node *>(chain.prev);
            unlink(n);
        }
    }